

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesBodyOwnMass::Build_M
          (ChVariablesBodyOwnMass *this,ChSparseMatrix *storage,int insrow,int inscol,double c_a)

{
  long lVar1;
  double *pdVar2;
  int j;
  long lVar3;
  bool bVar4;
  ChMatrix33<double> scaledJ;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  (**storage->_vptr_SparseMatrix)
            (c_a * this->mass,storage,(ulong)(uint)insrow,(ulong)(uint)inscol,1);
  (**storage->_vptr_SparseMatrix)
            (c_a * this->mass,storage,(ulong)(insrow + 1),(ulong)(inscol + 1),1);
  (**storage->_vptr_SparseMatrix)
            (c_a * this->mass,storage,(ulong)(insrow + 2),(ulong)(inscol + 2),1);
  pdVar2 = &local_78;
  local_78 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
  dStack_70 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
  local_68 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
  dStack_60 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[3];
  local_58 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
  dStack_50 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
  local_48 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
  dStack_40 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[7];
  local_38 = c_a * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
  lVar1 = 0;
  do {
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                (pdVar2[lVar3],storage,(ulong)(uint)(insrow + 3 + (int)lVar1),
                 (ulong)(uint)(inscol + 3 + (int)lVar3),1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pdVar2 = pdVar2 + 3;
    bVar4 = lVar1 != 2;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  return;
}

Assistant:

void ChVariablesBodyOwnMass::Build_M(ChSparseMatrix& storage, int insrow, int inscol, const double c_a) {
    storage.SetElement(insrow + 0, inscol + 0, c_a * mass);
    storage.SetElement(insrow + 1, inscol + 1, c_a * mass);
    storage.SetElement(insrow + 2, inscol + 2, c_a * mass);
    ChMatrix33<> scaledJ = inertia * c_a;
    PasteMatrix(storage, scaledJ, insrow + 3, inscol + 3);
}